

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tif_fax3.c
# Opt level: O1

int Fax3Encode2DRow(TIFF *tif,uchar *bp,uchar *rp,uint32_t bits)

{
  byte *pbVar1;
  byte bVar2;
  uint uVar3;
  ulong uVar4;
  uint uVar5;
  int iVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  byte *pbVar12;
  tableentry *tab;
  ulong uVar13;
  ulong uVar14;
  uint32_t uVar15;
  uint32_t uVar16;
  byte *pbVar17;
  uint32_t uVar18;
  uint32_t uVar19;
  uint uVar20;
  uchar *puVar21;
  byte bVar22;
  long lVar23;
  ulong uVar24;
  bool bVar25;
  bool bVar26;
  bool bVar27;
  
  uVar4 = 0;
  uVar24 = 0;
  if (-1 < (char)*bp) {
    uVar5 = 0;
    pbVar12 = bp;
    uVar15 = bits;
    if (0x7f < (int)bits) {
      bVar25 = ((ulong)bp & 7) == 0;
      if (bVar25) {
        uVar5 = 0;
LAB_002a181e:
        uVar18 = uVar15;
        if (0x3f < (int)uVar15) {
          do {
            uVar15 = uVar18;
            if (*(long *)pbVar12 != 0) break;
            uVar5 = uVar5 + 0x40;
            uVar15 = uVar18 - 0x40;
            pbVar12 = pbVar12 + 8;
            bVar26 = 0x7f < (int)uVar18;
            uVar18 = uVar15;
          } while (bVar26);
        }
      }
      else {
        bVar2 = *bp;
        uVar5 = 0;
        if (bVar2 == 0) {
          pbVar17 = bp + 1;
          pbVar1 = pbVar17;
          uVar7 = 0;
          do {
            pbVar12 = pbVar1;
            uVar5 = uVar7 + 8;
            bVar25 = ((ulong)pbVar17 & 7) == 0;
            if (bVar25) {
              uVar15 = (bits - uVar7) - 8;
              goto LAB_002a181e;
            }
            bVar2 = *pbVar12;
            pbVar17 = pbVar17 + 1;
            pbVar1 = pbVar12 + 1;
            uVar7 = uVar5;
          } while (bVar2 == 0);
          uVar15 = bits - uVar5;
        }
        uVar24 = (ulong)("\b\a\x06\x06\x05\x05\x05\x05\x04\x04\x04\x04\x04\x04\x04\x04\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01"
                         [bVar2] + uVar5);
      }
      if (!bVar25) goto LAB_002a18a3;
    }
    if (7 < (int)uVar15) {
      iVar6 = -uVar5;
      uVar18 = uVar15;
      do {
        if ((ulong)*pbVar12 != 0) {
          uVar24 = (ulong)((uint)"\b\a\x06\x06\x05\x05\x05\x05\x04\x04\x04\x04\x04\x04\x04\x04\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01"
                                 [*pbVar12] - iVar6);
          goto LAB_002a18a3;
        }
        uVar15 = uVar18 - 8;
        pbVar12 = pbVar12 + 1;
        iVar6 = iVar6 + -8;
        bVar25 = 0xf < (int)uVar18;
        uVar18 = uVar15;
      } while (bVar25);
      uVar5 = -iVar6;
    }
    if ((int)uVar15 < 1) {
      uVar24 = (ulong)uVar5;
    }
    else {
      uVar7 = (uint)"\b\a\x06\x06\x05\x05\x05\x05\x04\x04\x04\x04\x04\x04\x04\x04\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01"
                    [*pbVar12];
      if ((int)uVar15 <
          (int)(uint)"\b\a\x06\x06\x05\x05\x05\x05\x04\x04\x04\x04\x04\x04\x04\x04\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01"
                     [*pbVar12]) {
        uVar7 = uVar15;
      }
      uVar24 = (ulong)(uVar7 + uVar5);
    }
  }
LAB_002a18a3:
  if (-1 < (char)*rp) {
    uVar7 = 0;
    pbVar12 = rp;
    uVar5 = bits;
    if (0x7f < (int)bits) {
      bVar25 = ((ulong)rp & 7) == 0;
      if (bVar25) {
        uVar7 = 0;
LAB_002a1930:
        uVar8 = uVar5;
        if (0x3f < (int)uVar5) {
          do {
            uVar5 = uVar8;
            if (*(long *)pbVar12 != 0) break;
            uVar7 = uVar7 + 0x40;
            uVar5 = uVar8 - 0x40;
            pbVar12 = pbVar12 + 8;
            bVar26 = 0x7f < (int)uVar8;
            uVar8 = uVar5;
          } while (bVar26);
        }
      }
      else {
        uVar4 = (ulong)*rp;
        uVar7 = 0;
        if (*rp == 0) {
          pbVar17 = rp + 1;
          pbVar1 = pbVar17;
          uVar5 = 0;
          do {
            pbVar12 = pbVar1;
            uVar7 = uVar5 + 8;
            bVar25 = ((ulong)pbVar17 & 7) == 0;
            if (bVar25) {
              uVar5 = (bits - uVar5) - 8;
              goto LAB_002a1930;
            }
            uVar4 = (ulong)*pbVar12;
            pbVar17 = pbVar17 + 1;
            pbVar1 = pbVar12 + 1;
            uVar5 = uVar7;
          } while (*pbVar12 == 0);
          uVar5 = bits - uVar7;
        }
        uVar4 = (ulong)("\b\a\x06\x06\x05\x05\x05\x05\x04\x04\x04\x04\x04\x04\x04\x04\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01"
                        [uVar4] + uVar7);
      }
      if (!bVar25) goto LAB_002a19af;
    }
    if (7 < (int)uVar5) {
      iVar6 = -uVar7;
      uVar7 = uVar5;
      do {
        if ((ulong)*pbVar12 != 0) {
          uVar4 = (ulong)((uint)"\b\a\x06\x06\x05\x05\x05\x05\x04\x04\x04\x04\x04\x04\x04\x04\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01"
                                [*pbVar12] - iVar6);
          goto LAB_002a19af;
        }
        uVar5 = uVar7 - 8;
        pbVar12 = pbVar12 + 1;
        iVar6 = iVar6 + -8;
        bVar25 = 0xf < (int)uVar7;
        uVar7 = uVar5;
      } while (bVar25);
      uVar7 = -iVar6;
    }
    if ((int)uVar5 < 1) {
      uVar4 = (ulong)uVar7;
    }
    else {
      uVar8 = (uint)"\b\a\x06\x06\x05\x05\x05\x05\x04\x04\x04\x04\x04\x04\x04\x04\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01"
                    [*pbVar12];
      if ((int)uVar5 <
          (int)(uint)"\b\a\x06\x06\x05\x05\x05\x05\x04\x04\x04\x04\x04\x04\x04\x04\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01"
                     [*pbVar12]) {
        uVar8 = uVar5;
      }
      uVar4 = (ulong)(uVar8 + uVar7);
    }
  }
LAB_002a19af:
  uVar14 = 0;
LAB_002a19bd:
  uVar5 = (uint)uVar24;
  uVar13 = (ulong)bits;
  uVar7 = (uint)uVar4;
  if (uVar7 < bits) {
    uVar8 = uVar7 & 7;
    bVar2 = (byte)uVar8;
    pbVar12 = rp + ((int)uVar7 >> 3);
    uVar15 = bits - uVar7;
    bVar25 = (uVar4 & 7) != 0;
    if ((rp[uVar4 >> 3] >> (bVar2 ^ 7) & 1) == 0) {
      uVar18 = 0;
      if (bVar25 && (uVar15 != 0 && (int)uVar7 <= (int)bits)) {
        uVar19 = 8 - uVar8;
        if ((uint)"\b\a\x06\x06\x05\x05\x05\x05\x04\x04\x04\x04\x04\x04\x04\x04\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01"
                  [(uint)*pbVar12 << bVar2 & 0xfe] <= 8 - uVar8) {
          uVar19 = (uint)"\b\a\x06\x06\x05\x05\x05\x05\x04\x04\x04\x04\x04\x04\x04\x04\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01"
                         [(uint)*pbVar12 << bVar2 & 0xfe];
        }
        if ((int)uVar15 <= (int)uVar19) {
          uVar19 = uVar15;
        }
        if ((int)(uVar8 + uVar19) < 8) goto LAB_002a1c57;
        uVar15 = uVar15 - uVar19;
        pbVar12 = pbVar12 + 1;
        uVar18 = uVar19;
      }
      if (0x7f < (int)uVar15) {
        bVar25 = ((ulong)pbVar12 & 7) == 0;
        if (bVar25) {
LAB_002a1beb:
          uVar16 = uVar15;
          uVar19 = bits;
          if (0x3f < (int)uVar15) {
            do {
              uVar15 = uVar16;
              if (*(long *)pbVar12 != 0) break;
              uVar18 = uVar18 + 0x40;
              uVar15 = uVar16 - 0x40;
              pbVar12 = pbVar12 + 8;
              bVar26 = 0x7f < (int)uVar16;
              uVar16 = uVar15;
            } while (bVar26);
          }
        }
        else {
          bVar2 = *pbVar12;
          if (bVar2 == 0) {
            iVar6 = -uVar15;
            lVar23 = 0;
            do {
              uVar18 = uVar18 + 8;
              bVar25 = ((int)pbVar12 + 1 + (int)lVar23 & 7U) == 0;
              if (bVar25) {
                pbVar12 = pbVar12 + lVar23 + 1;
                uVar15 = -iVar6 - 8;
                goto LAB_002a1beb;
              }
              bVar2 = pbVar12[lVar23 + 1];
              lVar23 = lVar23 + 1;
              iVar6 = iVar6 + 8;
            } while (bVar2 == 0);
            pbVar12 = pbVar12 + lVar23;
            uVar15 = -iVar6;
          }
          uVar19 = "\b\a\x06\x06\x05\x05\x05\x05\x04\x04\x04\x04\x04\x04\x04\x04\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01"
                   [bVar2] + uVar18;
        }
        if (!bVar25) goto LAB_002a1c57;
      }
      uVar19 = uVar18;
      if (7 < (int)uVar15) {
        iVar6 = -uVar19;
        uVar18 = uVar15;
LAB_002a1c19:
        if ((ulong)*pbVar12 == 0) goto code_r0x002a1c21;
        bVar2 = "\b\a\x06\x06\x05\x05\x05\x05\x04\x04\x04\x04\x04\x04\x04\x04\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01"
                [*pbVar12];
LAB_002a1c55:
        uVar19 = (uint)bVar2 - iVar6;
        goto LAB_002a1c57;
      }
      goto LAB_002a1c37;
    }
    uVar18 = 0;
    if (bVar25 && (uVar15 != 0 && (int)uVar7 <= (int)bits)) {
      uVar19 = 8 - uVar8;
      if ((uint)""[(uint)*pbVar12 << bVar2 & 0xfe] <= 8 - uVar8) {
        uVar19 = (uint)""[(uint)*pbVar12 << bVar2 & 0xfe];
      }
      if ((int)uVar15 <= (int)uVar19) {
        uVar19 = uVar15;
      }
      if ((int)(uVar8 + uVar19) < 8) goto LAB_002a1c57;
      uVar15 = uVar15 - uVar19;
      pbVar12 = pbVar12 + 1;
      uVar18 = uVar19;
    }
    if (0x7f < (int)uVar15) {
      bVar25 = ((ulong)pbVar12 & 7) == 0;
      if (bVar25) {
LAB_002a1b60:
        uVar16 = uVar15;
        uVar19 = bits;
        if (0x3f < (int)uVar15) {
          do {
            uVar15 = uVar16;
            if (*(long *)pbVar12 != -1) break;
            uVar18 = uVar18 + 0x40;
            uVar15 = uVar16 - 0x40;
            pbVar12 = pbVar12 + 8;
            bVar26 = 0x7f < (int)uVar16;
            uVar16 = uVar15;
          } while (bVar26);
        }
      }
      else {
        bVar2 = *pbVar12;
        if (bVar2 == 0xff) {
          iVar6 = -uVar15;
          lVar23 = 0;
          do {
            uVar18 = uVar18 + 8;
            bVar25 = ((int)pbVar12 + 1 + (int)lVar23 & 7U) == 0;
            if (bVar25) {
              pbVar12 = pbVar12 + lVar23 + 1;
              uVar15 = -iVar6 - 8;
              goto LAB_002a1b60;
            }
            bVar2 = pbVar12[lVar23 + 1];
            lVar23 = lVar23 + 1;
            iVar6 = iVar6 + 8;
          } while (bVar2 == 0xff);
          pbVar12 = pbVar12 + lVar23;
          uVar15 = -iVar6;
        }
        uVar19 = ""[bVar2] + uVar18;
      }
      if (!bVar25) goto LAB_002a1c57;
    }
    uVar19 = uVar18;
    if (7 < (int)uVar15) {
      iVar6 = -uVar19;
      uVar18 = uVar15;
      do {
        if ((ulong)*pbVar12 != 0xff) {
          bVar2 = ""[*pbVar12];
          goto LAB_002a1c55;
        }
        uVar15 = uVar18 - 8;
        pbVar12 = pbVar12 + 1;
        iVar6 = iVar6 + -8;
        bVar25 = 0xf < (int)uVar18;
        uVar18 = uVar15;
      } while (bVar25);
      uVar19 = -iVar6;
    }
    if (0 < (int)uVar15) {
      bVar2 = ""[*pbVar12];
      goto LAB_002a1c43;
    }
    goto LAB_002a1c57;
  }
  goto LAB_002a1c59;
code_r0x002a1c21:
  uVar15 = uVar18 - 8;
  pbVar12 = pbVar12 + 1;
  iVar6 = iVar6 + -8;
  bVar25 = (int)uVar18 < 0x10;
  uVar18 = uVar15;
  if (bVar25) goto code_r0x002a1c31;
  goto LAB_002a1c19;
code_r0x002a1c31:
  uVar19 = -iVar6;
LAB_002a1c37:
  if (0 < (int)uVar15) {
    bVar2 = "\b\a\x06\x06\x05\x05\x05\x05\x04\x04\x04\x04\x04\x04\x04\x04\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01"
            [*pbVar12];
LAB_002a1c43:
    uVar8 = (uint)bVar2;
    if ((int)uVar15 < (int)(uint)bVar2) {
      uVar8 = uVar15;
    }
    uVar19 = uVar8 + uVar19;
  }
LAB_002a1c57:
  uVar13 = (ulong)(uVar19 + uVar7);
LAB_002a1c59:
  if (uVar5 <= (uint)uVar13) {
    uVar8 = uVar7 - uVar5;
    if ((((uVar7 < uVar5) || (3 < uVar8)) && (uVar8 = 0x7fffffff, uVar7 < uVar5)) &&
       (uVar8 = -(uVar5 - uVar7), 3 < uVar5 - uVar7)) {
      uVar8 = 0x7fffffff;
    }
    if (3 < (int)uVar8) {
      uVar4 = (ulong)bits;
      if (uVar5 < bits) {
        uVar7 = uVar5 & 7;
        bVar2 = (byte)uVar7;
        pbVar12 = bp + ((int)uVar5 >> 3);
        uVar15 = bits - uVar5;
        bVar25 = (uVar24 & 7) != 0;
        if ((bp[uVar24 >> 3] >> (bVar2 ^ 7) & 1) == 0) {
          uVar18 = 0;
          if (bVar25 && (uVar15 != 0 && (int)uVar5 <= (int)bits)) {
            uVar19 = 8 - uVar7;
            if ((uint)"\b\a\x06\x06\x05\x05\x05\x05\x04\x04\x04\x04\x04\x04\x04\x04\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01"
                      [(uint)*pbVar12 << bVar2 & 0xfe] <= 8 - uVar7) {
              uVar19 = (uint)"\b\a\x06\x06\x05\x05\x05\x05\x04\x04\x04\x04\x04\x04\x04\x04\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01"
                             [(uint)*pbVar12 << bVar2 & 0xfe];
            }
            if ((int)uVar15 <= (int)uVar19) {
              uVar19 = uVar15;
            }
            if ((int)(uVar7 + uVar19) < 8) goto LAB_002a1f6e;
            uVar15 = uVar15 - uVar19;
            pbVar12 = pbVar12 + 1;
            uVar18 = uVar19;
          }
          if (0x7f < (int)uVar15) {
            bVar25 = ((ulong)pbVar12 & 7) == 0;
            if (bVar25) {
LAB_002a1f05:
              uVar16 = uVar15;
              uVar19 = bits;
              if (0x3f < (int)uVar15) {
                do {
                  uVar15 = uVar16;
                  if (*(long *)pbVar12 != 0) break;
                  uVar18 = uVar18 + 0x40;
                  uVar15 = uVar16 - 0x40;
                  pbVar12 = pbVar12 + 8;
                  bVar26 = 0x7f < (int)uVar16;
                  uVar16 = uVar15;
                } while (bVar26);
              }
            }
            else {
              bVar2 = *pbVar12;
              if (bVar2 == 0) {
                iVar6 = -uVar15;
                lVar23 = 0;
                do {
                  uVar18 = uVar18 + 8;
                  bVar25 = ((int)pbVar12 + 1 + (int)lVar23 & 7U) == 0;
                  if (bVar25) {
                    pbVar12 = pbVar12 + lVar23 + 1;
                    uVar15 = -iVar6 - 8;
                    goto LAB_002a1f05;
                  }
                  bVar2 = pbVar12[lVar23 + 1];
                  lVar23 = lVar23 + 1;
                  iVar6 = iVar6 + 8;
                } while (bVar2 == 0);
                pbVar12 = pbVar12 + lVar23;
                uVar15 = -iVar6;
              }
              uVar19 = "\b\a\x06\x06\x05\x05\x05\x05\x04\x04\x04\x04\x04\x04\x04\x04\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01"
                       [bVar2] + uVar18;
            }
            if (!bVar25) goto LAB_002a1f6e;
          }
          uVar19 = uVar18;
          if (7 < (int)uVar15) {
            iVar6 = -uVar19;
            uVar18 = uVar15;
LAB_002a1f30:
            if ((ulong)*pbVar12 == 0) goto code_r0x002a1f38;
            bVar2 = "\b\a\x06\x06\x05\x05\x05\x05\x04\x04\x04\x04\x04\x04\x04\x04\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01"
                    [*pbVar12];
LAB_002a1f6c:
            uVar19 = (uint)bVar2 - iVar6;
            goto LAB_002a1f6e;
          }
          goto LAB_002a1f4e;
        }
        uVar18 = 0;
        if (bVar25 && (uVar15 != 0 && (int)uVar5 <= (int)bits)) {
          uVar19 = 8 - uVar7;
          if ((uint)""[(uint)*pbVar12 << bVar2 & 0xfe] <= 8 - uVar7) {
            uVar19 = (uint)""[(uint)*pbVar12 << bVar2 & 0xfe];
          }
          if ((int)uVar15 <= (int)uVar19) {
            uVar19 = uVar15;
          }
          if ((int)(uVar7 + uVar19) < 8) goto LAB_002a1f6e;
          uVar15 = uVar15 - uVar19;
          pbVar12 = pbVar12 + 1;
          uVar18 = uVar19;
        }
        if (0x7f < (int)uVar15) {
          bVar25 = ((ulong)pbVar12 & 7) == 0;
          if (bVar25) {
LAB_002a1e80:
            uVar16 = uVar15;
            uVar19 = bits;
            if (0x3f < (int)uVar15) {
              do {
                uVar15 = uVar16;
                if (*(long *)pbVar12 != -1) break;
                uVar18 = uVar18 + 0x40;
                uVar15 = uVar16 - 0x40;
                pbVar12 = pbVar12 + 8;
                bVar26 = 0x7f < (int)uVar16;
                uVar16 = uVar15;
              } while (bVar26);
            }
          }
          else {
            bVar2 = *pbVar12;
            if (bVar2 == 0xff) {
              iVar6 = -uVar15;
              lVar23 = 0;
              do {
                uVar18 = uVar18 + 8;
                bVar25 = ((int)pbVar12 + 1 + (int)lVar23 & 7U) == 0;
                if (bVar25) {
                  pbVar12 = pbVar12 + lVar23 + 1;
                  uVar15 = -iVar6 - 8;
                  goto LAB_002a1e80;
                }
                bVar2 = pbVar12[lVar23 + 1];
                lVar23 = lVar23 + 1;
                iVar6 = iVar6 + 8;
              } while (bVar2 == 0xff);
              pbVar12 = pbVar12 + lVar23;
              uVar15 = -iVar6;
            }
            uVar19 = ""[bVar2] + uVar18;
          }
          if (!bVar25) goto LAB_002a1f6e;
        }
        uVar19 = uVar18;
        if (7 < (int)uVar15) {
          iVar6 = -uVar19;
          uVar18 = uVar15;
          do {
            if ((ulong)*pbVar12 != 0xff) {
              bVar2 = ""[*pbVar12];
              goto LAB_002a1f6c;
            }
            uVar15 = uVar18 - 8;
            pbVar12 = pbVar12 + 1;
            iVar6 = iVar6 + -8;
            bVar25 = 0xf < (int)uVar18;
            uVar18 = uVar15;
          } while (bVar25);
          uVar19 = -iVar6;
        }
        if (0 < (int)uVar15) {
          bVar2 = ""[*pbVar12];
          goto LAB_002a1f5a;
        }
        goto LAB_002a1f6e;
      }
      goto LAB_002a1f71;
    }
    iVar6 = Fax3PutBits(tif,(uint)vcodes[uVar8 + 3].code,(uint)vcodes[uVar8 + 3].length);
    uVar4 = uVar24;
    uVar7 = uVar5;
    if (iVar6 == 0) goto LAB_002a2036;
LAB_002a2030:
    bVar25 = true;
    uVar14 = uVar4;
    uVar5 = uVar7;
    goto LAB_002a2049;
  }
  iVar6 = Fax3PutBits(tif,1,4);
  uVar14 = uVar13;
  if (iVar6 == 0) {
    return 0;
  }
LAB_002a2051:
  uVar7 = (uint)uVar14;
  if (bits <= uVar7) {
    return 1;
  }
  uVar3 = uVar7 & 7;
  bVar2 = (byte)uVar3;
  puVar21 = bp + ((int)uVar7 >> 3);
  uVar8 = bits - uVar7;
  bVar25 = (uVar14 & 7) != 0;
  uVar11 = 1 << (bVar2 ^ 7) & (uint)bp[uVar14 >> 3];
  if (uVar11 == 0) {
    uVar9 = 0;
    if (bVar25 && (uVar8 != 0 && (int)uVar7 <= (int)bits)) {
      uVar10 = 8 - uVar3;
      if ((uint)"\b\a\x06\x06\x05\x05\x05\x05\x04\x04\x04\x04\x04\x04\x04\x04\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01"
                [(uint)*puVar21 << bVar2 & 0xfe] <= 8 - uVar3) {
        uVar10 = (uint)"\b\a\x06\x06\x05\x05\x05\x05\x04\x04\x04\x04\x04\x04\x04\x04\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01"
                       [(uint)*puVar21 << bVar2 & 0xfe];
      }
      if ((int)uVar8 <= (int)uVar10) {
        uVar10 = uVar8;
      }
      if ((int)(uVar10 + uVar3) < 8) goto LAB_002a2335;
      uVar8 = uVar8 - uVar10;
      puVar21 = puVar21 + 1;
      uVar9 = uVar10;
    }
    if (0x7f < (int)uVar8) {
      bVar25 = ((ulong)puVar21 & 7) == 0;
      if (bVar25) {
LAB_002a22ba:
        uVar20 = uVar8;
        uVar10 = uVar5;
        if (0x3f < (int)uVar8) {
          do {
            uVar8 = uVar20;
            if (*(long *)puVar21 != 0) break;
            uVar9 = uVar9 + 0x40;
            uVar8 = uVar20 - 0x40;
            puVar21 = puVar21 + 8;
            bVar26 = 0x7f < (int)uVar20;
            uVar20 = uVar8;
          } while (bVar26);
        }
      }
      else {
        bVar22 = *puVar21;
        if (bVar22 == 0) {
          iVar6 = -uVar8;
          lVar23 = 0;
          do {
            uVar9 = uVar9 + 8;
            bVar25 = ((int)puVar21 + 1 + (int)lVar23 & 7U) == 0;
            if (bVar25) {
              puVar21 = puVar21 + lVar23 + 1;
              uVar8 = -iVar6 - 8;
              goto LAB_002a22ba;
            }
            bVar22 = puVar21[lVar23 + 1];
            lVar23 = lVar23 + 1;
            iVar6 = iVar6 + 8;
          } while (bVar22 == 0);
          puVar21 = puVar21 + lVar23;
          uVar8 = -iVar6;
        }
        uVar10 = "\b\a\x06\x06\x05\x05\x05\x05\x04\x04\x04\x04\x04\x04\x04\x04\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01"
                 [bVar22] + uVar9;
      }
      if (!bVar25) goto LAB_002a2335;
    }
    uVar10 = uVar9;
    if (7 < (int)uVar8) {
      iVar6 = -uVar10;
      uVar5 = uVar8;
      do {
        if ((ulong)*puVar21 != 0) {
          bVar22 = "\b\a\x06\x06\x05\x05\x05\x05\x04\x04\x04\x04\x04\x04\x04\x04\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01"
                   [*puVar21];
          goto LAB_002a2332;
        }
        uVar8 = uVar5 - 8;
        puVar21 = puVar21 + 1;
        iVar6 = iVar6 + -8;
        bVar25 = 0xf < (int)uVar5;
        uVar5 = uVar8;
      } while (bVar25);
      uVar10 = -iVar6;
    }
    if (0 < (int)uVar8) {
      bVar22 = "\b\a\x06\x06\x05\x05\x05\x05\x04\x04\x04\x04\x04\x04\x04\x04\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01"
               [*puVar21];
      goto LAB_002a231c;
    }
  }
  else {
    uVar9 = 0;
    if (bVar25 && (uVar8 != 0 && (int)uVar7 <= (int)bits)) {
      uVar10 = 8 - uVar3;
      if ((uint)""[(uint)*puVar21 << bVar2 & 0xfe] <= 8 - uVar3) {
        uVar10 = (uint)""[(uint)*puVar21 << bVar2 & 0xfe];
      }
      if ((int)uVar8 <= (int)uVar10) {
        uVar10 = uVar8;
      }
      if ((int)(uVar10 + uVar3) < 8) goto LAB_002a2335;
      uVar8 = uVar8 - uVar10;
      puVar21 = puVar21 + 1;
      uVar9 = uVar10;
    }
    if (0x7f < (int)uVar8) {
      bVar25 = ((ulong)puVar21 & 7) == 0;
      if (bVar25) {
LAB_002a221d:
        uVar20 = uVar8;
        uVar10 = uVar5;
        if (0x3f < (int)uVar8) {
          do {
            uVar8 = uVar20;
            if (*(long *)puVar21 != -1) break;
            uVar9 = uVar9 + 0x40;
            uVar8 = uVar20 - 0x40;
            puVar21 = puVar21 + 8;
            bVar26 = 0x7f < (int)uVar20;
            uVar20 = uVar8;
          } while (bVar26);
        }
      }
      else {
        bVar22 = *puVar21;
        if (bVar22 == 0xff) {
          iVar6 = -uVar8;
          lVar23 = 0;
          do {
            uVar9 = uVar9 + 8;
            bVar25 = ((int)puVar21 + 1 + (int)lVar23 & 7U) == 0;
            if (bVar25) {
              puVar21 = puVar21 + lVar23 + 1;
              uVar8 = -iVar6 - 8;
              goto LAB_002a221d;
            }
            bVar22 = puVar21[lVar23 + 1];
            lVar23 = lVar23 + 1;
            iVar6 = iVar6 + 8;
          } while (bVar22 == 0xff);
          puVar21 = puVar21 + lVar23;
          uVar8 = -iVar6;
        }
        uVar10 = ""[bVar22] + uVar9;
      }
      if (!bVar25) goto LAB_002a2335;
    }
    uVar10 = uVar9;
    if (7 < (int)uVar8) {
      iVar6 = -uVar10;
      uVar5 = uVar8;
LAB_002a2253:
      bVar22 = *puVar21;
      if ((ulong)bVar22 == 0xff) goto code_r0x002a2260;
      puVar21 = "";
      bVar22 = ""[bVar22];
LAB_002a2332:
      uVar10 = (uint)bVar22 - iVar6;
      goto LAB_002a2335;
    }
LAB_002a227a:
    if (0 < (int)uVar8) {
      bVar22 = ""[*puVar21];
LAB_002a231c:
      puVar21 = (byte *)0x0;
      uVar5 = (uint)bVar22;
      if ((int)uVar8 < (int)(uint)bVar22) {
        uVar5 = uVar8;
      }
      uVar10 = uVar5 + uVar10;
    }
  }
LAB_002a2335:
  pbVar12 = rp + ((int)uVar7 >> 3);
  uVar5 = bits - uVar7;
  bVar26 = uVar5 == 0;
  bVar25 = (int)bits < (int)uVar7;
  bVar27 = (uVar14 & 7) == 0;
  uVar8 = (uint)CONCAT71((int7)((ulong)puVar21 >> 8),bVar27 || (bVar26 || bVar25));
  if (uVar11 == 0) {
    uVar9 = 0;
    if (!bVar27 && (!bVar26 && !bVar25)) {
      bVar2 = ""[(uint)*pbVar12 << bVar2 & 0xfe];
      uVar8 = (uint)bVar2;
      uVar20 = 8 - uVar3;
      if ((uint)bVar2 <= 8 - uVar3) {
        uVar20 = (uint)bVar2;
      }
      if ((int)uVar5 <= (int)uVar20) {
        uVar20 = uVar5;
      }
      if ((int)(uVar3 + uVar20) < 8) goto LAB_002a25bd;
      uVar5 = uVar5 - uVar20;
      pbVar12 = pbVar12 + 1;
      uVar9 = uVar20;
    }
    if (0x7f < (int)uVar5) {
      bVar25 = ((ulong)pbVar12 & 7) == 0;
      uVar20 = uVar8;
      if (bVar25) {
LAB_002a253b:
        uVar8 = uVar5;
        if (0x3f < (int)uVar5) {
          do {
            uVar5 = uVar8;
            if (*(long *)pbVar12 != -1) break;
            uVar9 = uVar9 + 0x40;
            uVar5 = uVar8 - 0x40;
            pbVar12 = pbVar12 + 8;
            bVar26 = 0x7f < (int)uVar8;
            uVar8 = uVar5;
          } while (bVar26);
        }
      }
      else {
        bVar2 = *pbVar12;
        if (bVar2 == 0xff) {
          iVar6 = -uVar5;
          lVar23 = 0;
          do {
            uVar9 = uVar9 + 8;
            bVar25 = ((int)pbVar12 + 1 + (int)lVar23 & 7U) == 0;
            if (bVar25) {
              pbVar12 = pbVar12 + lVar23 + 1;
              uVar5 = -iVar6 - 8;
              uVar20 = uVar5;
              goto LAB_002a253b;
            }
            bVar2 = pbVar12[lVar23 + 1];
            lVar23 = lVar23 + 1;
            iVar6 = iVar6 + 8;
          } while (bVar2 == 0xff);
          pbVar12 = pbVar12 + lVar23;
          uVar5 = -iVar6;
        }
        uVar20 = ""[bVar2] + uVar9;
      }
      if (!bVar25) goto LAB_002a25bd;
    }
    uVar20 = uVar9;
    if (7 < (int)uVar5) {
      iVar6 = -uVar20;
      uVar8 = uVar5;
      do {
        if ((ulong)*pbVar12 != 0xff) {
          bVar2 = ""[*pbVar12];
          goto LAB_002a25bb;
        }
        uVar5 = uVar8 - 8;
        pbVar12 = pbVar12 + 1;
        iVar6 = iVar6 + -8;
        bVar25 = 0xf < (int)uVar8;
        uVar8 = uVar5;
      } while (bVar25);
      uVar20 = -iVar6;
    }
    if (0 < (int)uVar5) {
      bVar2 = ""[*pbVar12];
      goto LAB_002a25a3;
    }
  }
  else {
    uVar9 = 0;
    if (!bVar27 && (!bVar26 && !bVar25)) {
      bVar2 = "\b\a\x06\x06\x05\x05\x05\x05\x04\x04\x04\x04\x04\x04\x04\x04\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01"
              [(uint)*pbVar12 << bVar2 & 0xfe];
      uVar8 = (uint)bVar2;
      uVar20 = 8 - uVar3;
      if ((uint)bVar2 <= 8 - uVar3) {
        uVar20 = (uint)bVar2;
      }
      if ((int)uVar5 <= (int)uVar20) {
        uVar20 = uVar5;
      }
      if ((int)(uVar3 + uVar20) < 8) goto LAB_002a25bd;
      uVar5 = uVar5 - uVar20;
      pbVar12 = pbVar12 + 1;
      uVar9 = uVar20;
    }
    if (0x7f < (int)uVar5) {
      bVar25 = ((ulong)pbVar12 & 7) == 0;
      uVar20 = uVar8;
      if (bVar25) {
LAB_002a24b4:
        uVar8 = uVar5;
        if (0x3f < (int)uVar5) {
          do {
            uVar5 = uVar8;
            if (*(long *)pbVar12 != 0) break;
            uVar9 = uVar9 + 0x40;
            uVar5 = uVar8 - 0x40;
            pbVar12 = pbVar12 + 8;
            bVar26 = 0x7f < (int)uVar8;
            uVar8 = uVar5;
          } while (bVar26);
        }
      }
      else {
        bVar2 = *pbVar12;
        if (bVar2 == 0) {
          iVar6 = -uVar5;
          lVar23 = 0;
          do {
            uVar9 = uVar9 + 8;
            bVar25 = ((int)pbVar12 + 1 + (int)lVar23 & 7U) == 0;
            if (bVar25) {
              pbVar12 = pbVar12 + lVar23 + 1;
              uVar5 = -iVar6 - 8;
              uVar20 = uVar5;
              goto LAB_002a24b4;
            }
            bVar2 = pbVar12[lVar23 + 1];
            lVar23 = lVar23 + 1;
            iVar6 = iVar6 + 8;
          } while (bVar2 == 0);
          pbVar12 = pbVar12 + lVar23;
          uVar5 = -iVar6;
        }
        uVar20 = "\b\a\x06\x06\x05\x05\x05\x05\x04\x04\x04\x04\x04\x04\x04\x04\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01"
                 [bVar2] + uVar9;
      }
      if (!bVar25) goto LAB_002a25bd;
    }
    uVar20 = uVar9;
    if (7 < (int)uVar5) {
      iVar6 = -uVar20;
      uVar8 = uVar5;
LAB_002a24e9:
      if ((ulong)*pbVar12 == 0) goto code_r0x002a24f1;
      bVar2 = "\b\a\x06\x06\x05\x05\x05\x05\x04\x04\x04\x04\x04\x04\x04\x04\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01"
              [*pbVar12];
LAB_002a25bb:
      uVar20 = (uint)bVar2 - iVar6;
      goto LAB_002a25bd;
    }
LAB_002a250b:
    if (0 < (int)uVar5) {
      bVar2 = "\b\a\x06\x06\x05\x05\x05\x05\x04\x04\x04\x04\x04\x04\x04\x04\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01"
              [*pbVar12];
LAB_002a25a3:
      uVar8 = (uint)bVar2;
      if ((int)uVar5 < (int)(uint)bVar2) {
        uVar8 = uVar5;
      }
      uVar20 = uVar8 + uVar20;
    }
  }
LAB_002a25bd:
  uVar20 = uVar20 + uVar7;
  uVar5 = bits - uVar20;
  uVar8 = (int)uVar20 >> 3;
  pbVar12 = rp + (int)uVar8;
  if (uVar11 == 0) {
    uVar3 = 0;
    if ((0 < (int)uVar5) && (uVar11 = uVar20 & 7, uVar11 != 0)) {
      uVar8 = (uint)"\b\a\x06\x06\x05\x05\x05\x05\x04\x04\x04\x04\x04\x04\x04\x04\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01"
                    [(uint)*pbVar12 << (sbyte)uVar11 & 0xfe];
      uVar9 = 8 - uVar11;
      if (uVar8 <= 8 - uVar11) {
        uVar9 = uVar8;
      }
      if ((int)uVar5 <= (int)uVar9) {
        uVar9 = uVar5;
      }
      if ((int)(uVar11 + uVar9) < 8) goto LAB_002a2843;
      uVar5 = uVar5 - uVar9;
      pbVar12 = pbVar12 + 1;
      uVar3 = uVar9;
    }
    if (0x7f < (int)uVar5) {
      bVar25 = ((ulong)pbVar12 & 7) == 0;
      uVar9 = uVar8;
      if (bVar25) {
LAB_002a27d0:
        uVar8 = uVar5;
        if (0x3f < (int)uVar5) {
          do {
            uVar5 = uVar8;
            if (*(long *)pbVar12 != 0) break;
            uVar3 = uVar3 + 0x40;
            uVar5 = uVar8 - 0x40;
            pbVar12 = pbVar12 + 8;
            bVar26 = 0x7f < (int)uVar8;
            uVar8 = uVar5;
          } while (bVar26);
        }
      }
      else {
        bVar2 = *pbVar12;
        if (bVar2 == 0) {
          iVar6 = -uVar5;
          lVar23 = 0;
          do {
            uVar3 = uVar3 + 8;
            bVar25 = ((int)pbVar12 + 1 + (int)lVar23 & 7U) == 0;
            if (bVar25) {
              pbVar12 = pbVar12 + lVar23 + 1;
              uVar5 = -iVar6 - 8;
              uVar9 = uVar5;
              goto LAB_002a27d0;
            }
            bVar2 = pbVar12[lVar23 + 1];
            lVar23 = lVar23 + 1;
            iVar6 = iVar6 + 8;
          } while (bVar2 == 0);
          pbVar12 = pbVar12 + lVar23;
          uVar5 = -iVar6;
        }
        uVar9 = "\b\a\x06\x06\x05\x05\x05\x05\x04\x04\x04\x04\x04\x04\x04\x04\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01"
                [bVar2] + uVar3;
      }
      if (!bVar25) goto LAB_002a2843;
    }
    uVar9 = uVar3;
    if (7 < (int)uVar5) {
      iVar6 = -uVar9;
      uVar8 = uVar5;
      do {
        if ((ulong)*pbVar12 != 0) {
          bVar2 = "\b\a\x06\x06\x05\x05\x05\x05\x04\x04\x04\x04\x04\x04\x04\x04\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01"
                  [*pbVar12];
          goto LAB_002a2841;
        }
        uVar5 = uVar8 - 8;
        pbVar12 = pbVar12 + 1;
        iVar6 = iVar6 + -8;
        bVar25 = 0xf < (int)uVar8;
        uVar8 = uVar5;
      } while (bVar25);
      uVar9 = -iVar6;
    }
    if ((int)uVar5 < 1) goto LAB_002a2843;
    bVar2 = "\b\a\x06\x06\x05\x05\x05\x05\x04\x04\x04\x04\x04\x04\x04\x04\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01"
            [*pbVar12];
  }
  else {
    uVar3 = 0;
    if ((0 < (int)uVar5) && (uVar11 = uVar20 & 7, uVar11 != 0)) {
      uVar8 = (uint)""[(uint)*pbVar12 << (sbyte)uVar11 & 0xfe];
      uVar9 = 8 - uVar11;
      if (uVar8 <= 8 - uVar11) {
        uVar9 = uVar8;
      }
      if ((int)uVar5 <= (int)uVar9) {
        uVar9 = uVar5;
      }
      if ((int)(uVar11 + uVar9) < 8) goto LAB_002a2843;
      uVar5 = uVar5 - uVar9;
      pbVar12 = pbVar12 + 1;
      uVar3 = uVar9;
    }
    if (0x7f < (int)uVar5) {
      bVar25 = ((ulong)pbVar12 & 7) == 0;
      uVar9 = uVar8;
      if (bVar25) {
LAB_002a273a:
        uVar8 = uVar5;
        if (0x3f < (int)uVar5) {
          do {
            uVar5 = uVar8;
            if (*(long *)pbVar12 != -1) break;
            uVar3 = uVar3 + 0x40;
            uVar5 = uVar8 - 0x40;
            pbVar12 = pbVar12 + 8;
            bVar26 = 0x7f < (int)uVar8;
            uVar8 = uVar5;
          } while (bVar26);
        }
      }
      else {
        bVar2 = *pbVar12;
        if (bVar2 == 0xff) {
          iVar6 = -uVar5;
          lVar23 = 0;
          do {
            uVar3 = uVar3 + 8;
            bVar25 = ((int)pbVar12 + 1 + (int)lVar23 & 7U) == 0;
            if (bVar25) {
              pbVar12 = pbVar12 + lVar23 + 1;
              uVar5 = -iVar6 - 8;
              uVar9 = uVar5;
              goto LAB_002a273a;
            }
            bVar2 = pbVar12[lVar23 + 1];
            lVar23 = lVar23 + 1;
            iVar6 = iVar6 + 8;
          } while (bVar2 == 0xff);
          pbVar12 = pbVar12 + lVar23;
          uVar5 = -iVar6;
        }
        uVar9 = ""[bVar2] + uVar3;
      }
      if (!bVar25) goto LAB_002a2843;
    }
    uVar9 = uVar3;
    if (7 < (int)uVar5) {
      iVar6 = -uVar3;
      uVar8 = uVar5;
LAB_002a276f:
      if ((ulong)*pbVar12 == 0xff) goto code_r0x002a277a;
      bVar2 = ""[*pbVar12];
LAB_002a2841:
      uVar9 = (uint)bVar2 - iVar6;
      goto LAB_002a2843;
    }
LAB_002a2794:
    if ((int)uVar5 < 1) goto LAB_002a2843;
    bVar2 = ""[*pbVar12];
  }
  uVar8 = (uint)bVar2;
  if ((int)uVar5 < (int)(uint)bVar2) {
    uVar8 = uVar5;
  }
  uVar9 = uVar8 + uVar9;
LAB_002a2843:
  uVar24 = (ulong)(uVar10 + uVar7);
  uVar4 = (ulong)(uVar9 + uVar20);
  goto LAB_002a19bd;
code_r0x002a1f38:
  uVar15 = uVar18 - 8;
  pbVar12 = pbVar12 + 1;
  iVar6 = iVar6 + -8;
  bVar25 = (int)uVar18 < 0x10;
  uVar18 = uVar15;
  if (bVar25) goto code_r0x002a1f48;
  goto LAB_002a1f30;
code_r0x002a1f48:
  uVar19 = -iVar6;
LAB_002a1f4e:
  if (0 < (int)uVar15) {
    bVar2 = "\b\a\x06\x06\x05\x05\x05\x05\x04\x04\x04\x04\x04\x04\x04\x04\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01"
            [*pbVar12];
LAB_002a1f5a:
    uVar7 = (uint)bVar2;
    if ((int)uVar15 < (int)(uint)bVar2) {
      uVar7 = uVar15;
    }
    uVar19 = uVar7 + uVar19;
  }
LAB_002a1f6e:
  uVar4 = (ulong)(uVar19 + uVar5);
LAB_002a1f71:
  iVar6 = Fax3PutBits(tif,1,3);
  if (iVar6 != 0) {
    iVar6 = (int)uVar14;
    uVar7 = (uint)tif;
    if ((iVar6 + uVar5 == 0) || ((bp[uVar14 >> 3] >> (~(byte)uVar14 & 7) & 1) == 0)) {
      iVar6 = putspan(tif,uVar5 - iVar6,TIFFFaxWhiteCodes);
      if (iVar6 != 0) {
        tab = TIFFFaxBlackCodes;
        goto LAB_002a201a;
      }
LAB_002a203a:
      bVar25 = false;
      uVar5 = uVar7;
      goto LAB_002a2049;
    }
    iVar6 = putspan(tif,uVar5 - iVar6,TIFFFaxBlackCodes);
    if (iVar6 == 0) goto LAB_002a203a;
    tab = TIFFFaxWhiteCodes;
LAB_002a201a:
    iVar6 = putspan(tif,(int)uVar4 - uVar5,tab);
    uVar5 = uVar7;
    if (iVar6 != 0) goto LAB_002a2030;
  }
LAB_002a2036:
  bVar25 = false;
LAB_002a2049:
  if (!bVar25) {
    return 0;
  }
  goto LAB_002a2051;
code_r0x002a2260:
  uVar8 = uVar5 - 8;
  puVar21 = puVar21 + 1;
  iVar6 = iVar6 + -8;
  bVar25 = (int)uVar5 < 0x10;
  uVar5 = uVar8;
  if (bVar25) goto code_r0x002a2273;
  goto LAB_002a2253;
code_r0x002a2273:
  uVar10 = -iVar6;
  goto LAB_002a227a;
code_r0x002a24f1:
  uVar5 = uVar8 - 8;
  pbVar12 = pbVar12 + 1;
  iVar6 = iVar6 + -8;
  bVar25 = (int)uVar8 < 0x10;
  uVar8 = uVar5;
  if (bVar25) goto code_r0x002a2504;
  goto LAB_002a24e9;
code_r0x002a2504:
  uVar20 = -iVar6;
  goto LAB_002a250b;
code_r0x002a277a:
  uVar5 = uVar8 - 8;
  pbVar12 = pbVar12 + 1;
  iVar6 = iVar6 + -8;
  bVar25 = (int)uVar8 < 0x10;
  uVar8 = uVar5;
  if (bVar25) goto code_r0x002a278d;
  goto LAB_002a276f;
code_r0x002a278d:
  uVar9 = -iVar6;
  goto LAB_002a2794;
}

Assistant:

static int Fax3Encode2DRow(TIFF *tif, unsigned char *bp, unsigned char *rp,
                           uint32_t bits)
{
#define PIXEL(buf, ix) ((((buf)[(ix) >> 3]) >> (7 - ((ix)&7))) & 1)
    uint32_t a0 = 0;
    uint32_t a1 = (PIXEL(bp, 0) != 0 ? 0 : finddiff(bp, 0, bits, 0));
    uint32_t b1 = (PIXEL(rp, 0) != 0 ? 0 : finddiff(rp, 0, bits, 0));
    uint32_t a2, b2;

    for (;;)
    {
        b2 = finddiff2(rp, b1, bits, PIXEL(rp, b1));
        if (b2 >= a1)
        {
            /* Naive computation triggers
             * -fsanitize=undefined,unsigned-integer-overflow */
            /* although it is correct unless the difference between both is < 31
             * bit */
            /* int32_t d = b1 - a1; */
            int32_t d = (b1 >= a1 && b1 - a1 <= 3U)  ? (int32_t)(b1 - a1)
                        : (b1 < a1 && a1 - b1 <= 3U) ? -(int32_t)(a1 - b1)
                                                     : 0x7FFFFFFF;
            if (!(-3 <= d && d <= 3))
            { /* horizontal mode */
                a2 = finddiff2(bp, a1, bits, PIXEL(bp, a1));
                if (!putcode(tif, &horizcode))
                    return 0;
                if (a0 + a1 == 0 || PIXEL(bp, a0) == 0)
                {
                    if (!putspan(tif, a1 - a0, TIFFFaxWhiteCodes))
                        return 0;
                    if (!putspan(tif, a2 - a1, TIFFFaxBlackCodes))
                        return 0;
                }
                else
                {
                    if (!putspan(tif, a1 - a0, TIFFFaxBlackCodes))
                        return 0;
                    if (!putspan(tif, a2 - a1, TIFFFaxWhiteCodes))
                        return 0;
                }
                a0 = a2;
            }
            else
            { /* vertical mode */
                if (!putcode(tif, &vcodes[d + 3]))
                    return 0;
                a0 = a1;
            }
        }
        else
        { /* pass mode */
            if (!putcode(tif, &passcode))
                return 0;
            a0 = b2;
        }
        if (a0 >= bits)
            break;
        a1 = finddiff(bp, a0, bits, PIXEL(bp, a0));
        b1 = finddiff(rp, a0, bits, !PIXEL(bp, a0));
        b1 = finddiff(rp, b1, bits, PIXEL(bp, a0));
    }
    return (1);
#undef PIXEL
}